

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
mesh::createb(vector<float,_std::allocator<float>_> *__return_storage_ptr__,mesh *this,int r,int c,
             int m,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *volt,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *mcurrent)

{
  float fVar1;
  size_type __n;
  reference this_00;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  allocator<float> local_5d;
  value_type_conflict2 local_5c;
  vector<float,_std::allocator<float>_> local_58;
  int local_40;
  int local_3c;
  int k;
  int j;
  int i;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *volt_local;
  int local_20;
  int m_local;
  int c_local;
  int r_local;
  mesh *this_local;
  vector<float,_std::allocator<float>_> *b;
  
  j._3_1_ = 0;
  _i = volt;
  volt_local._4_4_ = m;
  local_20 = c;
  m_local = r;
  _c_local = this;
  this_local = (mesh *)__return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  __n = (size_type)volt_local._4_4_;
  local_5c = 0.0;
  std::allocator<float>::allocator(&local_5d);
  std::vector<float,_std::allocator<float>_>::vector(&local_58,__n,&local_5c,&local_5d);
  std::vector<float,_std::allocator<float>_>::operator=(__return_storage_ptr__,&local_58);
  std::vector<float,_std::allocator<float>_>::~vector(&local_58);
  std::allocator<float>::~allocator(&local_5d);
  for (local_40 = 1; local_40 < local_20 + -1; local_40 = m_local + 1 + local_40) {
    for (k = 0; k < m_local; k = k + 1) {
      for (local_3c = 0; local_3c < m_local; local_3c = local_3c + 1) {
        this_00 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](mcurrent,(long)k);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (this_00,(long)(local_3c + local_40));
        if (*pvVar2 == 1) {
          pvVar3 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](_i,(long)k);
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)local_3c);
          if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
            pvVar3 = std::
                     vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ::operator[](_i,(long)k);
            pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)local_3c);
            fVar1 = *pvVar4;
            pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                               (__return_storage_ptr__,(long)(local_40 / m_local));
            *pvVar4 = fVar1 + *pvVar4;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto createb( int r, int c, int m, std::vector<std::vector<float>> &volt, std::vector<std::vector<int>> &mcurrent)
    {
        std::vector<float> b;
        int i, j, k;
      //  std::vector<float> b;
        //initialise b to 0
        b=std::vector<float> (m, 0);

        for(k = 1; k < c-1; k += r+1)
        {
            for(i = 0; i < r; i++)
            {
                for(j = 0; j < r; j++)
                {
                    if(mcurrent[i][j+k]== 1 && volt[i][j]!=0)
                    {
                        b[k/r]+= volt[i][j];
                    }
                   // std::cerr << mcurrent[i][j+k] << " and " << volt[i][j] << "\n";

//                    std::cerr << mcurrent[i][j+k] << " and " <<volt[i][j] << "\t";
//                    std::cerr << "\n";
                 //   std::cerr << b[k/r] << "\n";
                }
            }
        }
        return b;

    }